

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapMatch.c
# Opt level: O2

float Amap_ManMaxDelay(Amap_Man_t *p)

{
  int iVar1;
  Amap_Obj_t *pAVar2;
  int i;
  int i_00;
  float fVar3;
  
  fVar3 = 0.0;
  for (i_00 = 0; i_00 < p->vPos->nSize; i_00 = i_00 + 1) {
    pAVar2 = (Amap_Obj_t *)Vec_PtrEntry(p->vPos,i_00);
    pAVar2 = Amap_ObjFanin0(p,pAVar2);
    iVar1 = (int)(pAVar2->Best).Delay;
    if (iVar1 < (int)fVar3) {
      iVar1 = (int)fVar3;
    }
    fVar3 = (float)iVar1;
  }
  return fVar3;
}

Assistant:

float Amap_ManMaxDelay( Amap_Man_t * p )
{
    Amap_Obj_t * pObj;
    float Delay = 0.0;
    int i;
    Amap_ManForEachPo( p, pObj, i )
        Delay = Abc_MaxInt( Delay, Amap_ObjFanin0(p,pObj)->Best.Delay );
    return Delay;
}